

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_database.cc
# Opt level: O0

bool __thiscall
google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::
AddExtension<google::protobuf::FieldDescriptorProto>
          (DescriptorIndex *this,string_view filename,FieldDescriptorProto *field)

{
  string_view v;
  int32_t v_00;
  ulong uVar1;
  string *psVar2;
  char *pcVar3;
  size_type sVar4;
  LogMessage *pLVar5;
  bool local_161;
  LogMessage local_120;
  Voidify local_109;
  DescriptorIndex *local_108;
  byte local_f9;
  int32_t local_f8;
  byte local_f1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
  local_d0;
  __normal_iterator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry_*,_std::vector<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry>_>_>
  local_a8;
  __normal_iterator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry_*,_std::vector<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry>_>_>
  local_a0;
  string_view local_88;
  value_type local_78;
  pair<absl::lts_20250127::container_internal::btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry>,_256,_false>_>,_const_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry_&,_const_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry_*>,_bool>
  local_48;
  FieldDescriptorProto *local_30;
  FieldDescriptorProto *field_local;
  DescriptorIndex *this_local;
  string_view filename_local;
  
  filename_local._M_len = (size_t)filename._M_str;
  this_local = (DescriptorIndex *)filename._M_len;
  local_30 = field;
  field_local = (FieldDescriptorProto *)this;
  FieldDescriptorProto::extendee_abi_cxx11_(field);
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    psVar2 = FieldDescriptorProto::extendee_abi_cxx11_(local_30);
    pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)psVar2);
    if (*pcVar3 == '.') {
      sVar4 = std::
              vector<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::EncodedEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::EncodedEntry>_>
              ::size(&this->all_values_);
      local_78.data_offset = (int)sVar4 + -1;
      psVar2 = FieldDescriptorProto::extendee_abi_cxx11_(local_30);
      local_88 = (string_view)
                 std::__cxx11::string::operator_cast_to_basic_string_view((string *)psVar2);
      EncodeString_abi_cxx11_(&local_78.encoded_extendee,this,local_88);
      local_f1 = 0;
      local_f9 = 0;
      local_78.extension_number = FieldDescriptorProto::number(local_30);
      absl::lts_20250127::container_internal::
      btree_set_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry>,_256,_false>_>_>
      ::insert(&local_48,
               &(this->by_extension_).
                super_btree_set_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry>,_256,_false>_>_>
               ,&local_78);
      local_161 = true;
      if ((local_48.second & 1U) != 0) {
        local_a0._M_current =
             (ExtensionEntry *)
             std::
             vector<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry>_>
             ::begin(&this->by_extension_flat_);
        local_a8._M_current =
             (ExtensionEntry *)
             std::
             vector<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry>_>
             ::end(&this->by_extension_flat_);
        psVar2 = FieldDescriptorProto::extendee_abi_cxx11_(local_30);
        std::__cxx11::string::substr((ulong)&local_f0,(ulong)psVar2);
        local_f1 = 1;
        local_f8 = FieldDescriptorProto::number(local_30);
        std::make_pair<std::__cxx11::string,int>(&local_d0,&local_f0,&local_f8);
        local_f9 = 1;
        local_108 = (DescriptorIndex *)
                    absl::lts_20250127::container_internal::
                    btree_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry>,_256,_false>_>_>
                    ::key_comp((btree_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry>,_256,_false>_>_>
                                *)&this->by_extension_);
        local_161 = std::
                    binary_search<__gnu_cxx::__normal_iterator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry*,std::vector<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry,std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry>>>,std::pair<std::__cxx11::string,int>,google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionCompare>
                              (local_a0,local_a8,&local_d0,(ExtensionCompare)local_108);
      }
      if ((local_f9 & 1) != 0) {
        std::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>::
        ~pair(&local_d0);
      }
      if ((local_f1 & 1) != 0) {
        std::__cxx11::string::~string((string *)&local_f0);
      }
      ExtensionEntry::~ExtensionEntry(&local_78);
      if (local_161 != false) {
        absl::lts_20250127::log_internal::LogMessage::LogMessage
                  (&local_120,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_database.cc"
                   ,0x319);
        pLVar5 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_120);
        pLVar5 = absl::lts_20250127::log_internal::LogMessage::operator<<
                           (pLVar5,(char (*) [64])
                                   "Extension conflicts with extension already in database: extend "
                           );
        psVar2 = FieldDescriptorProto::extendee_abi_cxx11_(local_30);
        pLVar5 = absl::lts_20250127::log_internal::LogMessage::operator<<(pLVar5,psVar2);
        pLVar5 = absl::lts_20250127::log_internal::LogMessage::operator<<
                           (pLVar5,(char (*) [4])" { ");
        psVar2 = FieldDescriptorProto::name_abi_cxx11_(local_30);
        pLVar5 = absl::lts_20250127::log_internal::LogMessage::operator<<(pLVar5,psVar2);
        pLVar5 = absl::lts_20250127::log_internal::LogMessage::operator<<
                           (pLVar5,(char (*) [4])0x68bf68);
        v_00 = FieldDescriptorProto::number(local_30);
        pLVar5 = absl::lts_20250127::log_internal::LogMessage::operator<<(pLVar5,v_00);
        pLVar5 = absl::lts_20250127::log_internal::LogMessage::operator<<
                           (pLVar5,(char (*) [9])" } from:");
        v._M_str = (char *)filename_local._M_len;
        v._M_len = (size_t)this_local;
        pLVar5 = absl::lts_20250127::log_internal::LogMessage::operator<<(pLVar5,v);
        absl::lts_20250127::log_internal::Voidify::operator&&(&local_109,pLVar5);
        absl::lts_20250127::log_internal::LogMessage::~LogMessage(&local_120);
        return false;
      }
    }
  }
  return true;
}

Assistant:

bool EncodedDescriptorDatabase::DescriptorIndex::AddExtension(
    absl::string_view filename, const FieldProto& field) {
  if (!field.extendee().empty() && field.extendee()[0] == '.') {
    // The extension is fully-qualified.  We can use it as a lookup key in
    // the by_symbol_ table.
    if (!by_extension_
             .insert({static_cast<int>(all_values_.size() - 1),
                      EncodeString(field.extendee()), field.number()})
             .second ||
        std::binary_search(
            by_extension_flat_.begin(), by_extension_flat_.end(),
            std::make_pair(field.extendee().substr(1), field.number()),
            by_extension_.key_comp())) {
      ABSL_LOG(ERROR)
          << "Extension conflicts with extension already in database: "
             "extend "
          << field.extendee() << " { " << field.name() << " = "
          << field.number() << " } from:" << filename;
      return false;
    }
  } else {
    // Not fully-qualified.  We can't really do anything here, unfortunately.
    // We don't consider this an error, though, because the descriptor is
    // valid.
  }
  return true;
}